

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O3

void * alsaCallbackHandler(void *ptr)

{
  RtApiAlsa *this;
  int iVar1;
  long lVar2;
  char *pcVar3;
  
  this = *ptr;
  if (*(char *)((long)ptr + 0x29) == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"RtAudio alsa: ",0xe);
    iVar1 = sched_getscheduler(0);
    pcVar3 = "_NOT_ ";
    if (iVar1 == 2) {
      pcVar3 = "";
    }
    lVar2 = 6;
    if (iVar1 == 2) {
      lVar2 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar3,lVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"running realtime scheduling",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
  }
  if (*(char *)((long)ptr + 0x28) == '\x01') {
    do {
      pthread_testcancel();
      RtApiAlsa::callbackEvent(this);
    } while (*(char *)((long)ptr + 0x28) != '\0');
  }
  pthread_exit((void *)0x0);
}

Assistant:

static void *alsaCallbackHandler( void *ptr )
{
  CallbackInfo *info = (CallbackInfo *) ptr;
  RtApiAlsa *object = (RtApiAlsa *) info->object;
  bool *isRunning = &info->isRunning;

#ifdef SCHED_RR // Undefined with some OSes (e.g. NetBSD 1.6.x with GNU Pthread)
  if ( info->doRealtime ) {
    std::cerr << "RtAudio alsa: " << 
             (sched_getscheduler(0) == SCHED_RR ? "" : "_NOT_ ") << 
             "running realtime scheduling" << std::endl;
  }
#endif

  while ( *isRunning == true ) {
    pthread_testcancel();
    object->callbackEvent();
  }

  pthread_exit( NULL );
}